

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzerSettings.cpp
# Opt level: O0

void __thiscall SpiAnalyzerSettings::LoadSettings(SpiAnalyzerSettings *this,char *settings)

{
  int iVar1;
  Channel local_78 [16];
  Channel local_68 [16];
  Channel local_58 [16];
  Channel local_48 [16];
  char *local_38;
  char *name_string;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  SpiAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&local_38);
  iVar1 = strcmp(local_38,"SaleaeSpiAnalyzer");
  if (iVar1 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeSpiAnalyzer: Provided with a settings string that doesn\'t belong to us;");
  }
  SimpleArchive::operator>>(local_20,&this->mMosiChannel);
  SimpleArchive::operator>>(local_20,&this->mMisoChannel);
  SimpleArchive::operator>>(local_20,&this->mClockChannel);
  SimpleArchive::operator>>(local_20,&this->mEnableChannel);
  SimpleArchive::operator>>(local_20,&this->mShiftOrder);
  SimpleArchive::operator>>(local_20,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(local_20,&this->mClockInactiveState);
  SimpleArchive::operator>>(local_20,&this->mDataValidEdge);
  SimpleArchive::operator>>(local_20,&this->mEnableActiveState);
  AnalyzerSettings::ClearChannels();
  Channel::Channel(local_48,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(&this->mMosiChannel,local_48);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMosiChannel,true);
  Channel::~Channel(local_48);
  Channel::Channel(local_58,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(&this->mMisoChannel,local_58);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mMisoChannel,true);
  Channel::~Channel(local_58);
  Channel::Channel(local_68,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(&this->mClockChannel,local_68);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  Channel::~Channel(local_68);
  Channel::Channel(local_78,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::operator!=(&this->mEnableChannel,local_78);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mEnableChannel,true);
  Channel::~Channel(local_78);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void SpiAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeSpiAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeSpiAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mMosiChannel;
    text_archive >> mMisoChannel;
    text_archive >> mClockChannel;
    text_archive >> mEnableChannel;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mBitsPerTransfer;
    text_archive >> *( U32* )&mClockInactiveState;
    text_archive >> *( U32* )&mDataValidEdge;
    text_archive >> *( U32* )&mEnableActiveState;

    // bool success = text_archive >> mUsePackets;  //new paramater added -- do this for backwards compatibility
    // if( success == false )
    //	mUsePackets = false; //if the archive fails, set the default value

    ClearChannels();
    AddChannel( mMosiChannel, "MOSI", mMosiChannel != UNDEFINED_CHANNEL );
    AddChannel( mMisoChannel, "MISO", mMisoChannel != UNDEFINED_CHANNEL );
    AddChannel( mClockChannel, "CLOCK", mClockChannel != UNDEFINED_CHANNEL );
    AddChannel( mEnableChannel, "ENABLE", mEnableChannel != UNDEFINED_CHANNEL );

    UpdateInterfacesFromSettings();
}